

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keymacro.c
# Opt level: O0

wchar_t node_lookup(EditLine *el,wchar_t *str,keymacro_node_t *ptr,size_t cnt)

{
  ssize_t sVar1;
  size_t px;
  ssize_t used;
  size_t cnt_local;
  keymacro_node_t *ptr_local;
  wchar_t *str_local;
  EditLine *el_local;
  
  if (ptr == (keymacro_node_t *)0x0) {
    el_local._4_4_ = L'\xffffffff';
  }
  else if ((str == (wchar_t *)0x0) || (*str == L'\0')) {
    node_enum(el,ptr,cnt);
    el_local._4_4_ = L'\0';
  }
  else if (ptr->ch == *str) {
    sVar1 = ct_visual_char((el->el_keymacro).buf + cnt,0x400 - cnt,ptr->ch);
    if (sVar1 == -1) {
      el_local._4_4_ = L'\xffffffff';
    }
    else if (ptr->next == (keymacro_node_t *)0x0) {
      if (str[1] == L'\0') {
        (el->el_keymacro).buf[cnt + sVar1] = L'\"';
        (el->el_keymacro).buf[cnt + sVar1 + 1] = L'\0';
        keymacro_kprint(el,(el->el_keymacro).buf,&ptr->val,ptr->type);
        el_local._4_4_ = L'\0';
      }
      else {
        el_local._4_4_ = L'\xffffffff';
      }
    }
    else {
      el_local._4_4_ = node_lookup(el,str + 1,ptr->next,sVar1 + cnt);
    }
  }
  else if (ptr->sibling == (keymacro_node_t *)0x0) {
    el_local._4_4_ = L'\xffffffff';
  }
  else {
    el_local._4_4_ = node_lookup(el,str,ptr->sibling,cnt);
  }
  return el_local._4_4_;
}

Assistant:

static int
node_lookup(EditLine *el, const wchar_t *str, keymacro_node_t *ptr,
    size_t cnt)
{
	ssize_t used;

	if (ptr == NULL)
		return -1;	/* cannot have null ptr */

	if (!str || *str == 0) {
		/* no more chars in str.  node_enum from here. */
		(void) node_enum(el, ptr, cnt);
		return 0;
	} else {
		/* If match put this char into el->el_keymacro.buf.  Recurse */
		if (ptr->ch == *str) {
			/* match found */
			used = ct_visual_char(el->el_keymacro.buf + cnt,
			    KEY_BUFSIZ - cnt, ptr->ch);
			if (used == -1)
				return -1; /* ran out of buffer space */
			if (ptr->next != NULL)
				/* not yet at leaf */
				return (node_lookup(el, str + 1, ptr->next,
				    (size_t)used + cnt));
			else {
			    /* next node is null so key should be complete */
				if (str[1] == 0) {
					size_t px = cnt + (size_t)used;
					el->el_keymacro.buf[px] = '"';
					el->el_keymacro.buf[px + 1] = '\0';
					keymacro_kprint(el, el->el_keymacro.buf,
					    &ptr->val, ptr->type);
					return 0;
				} else
					return -1;
					/* mismatch -- str still has chars */
			}
		} else {
			/* no match found try sibling */
			if (ptr->sibling)
				return (node_lookup(el, str, ptr->sibling,
				    cnt));
			else
				return -1;
		}
	}
}